

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void support_2_byte_xp_gold(dw_rom *rom)

{
  undefined4 local_14;
  int ss_lvl;
  dw_rom *rom_local;
  
  local_14 = 1;
  if ((rom->flags[6] & 0xc) != 0) {
    printf("Reducing early metal rewards...\n");
    if (0xff < rom->enemies[0x10].xp) {
      rom->enemies[0x10].xp = 0xff;
    }
    local_14 = 8;
  }
  vpatch(rom,0xea0f,0x4d,0xad,7,1,0x85,1,0xa5,0xe0,0xc9,0x10,0xd0,0xd,0xa5,199,0xc9,local_14,0xb0,7,
         10,10,10,10,10,0x85,0,0x20,0xcb,199,0xef,0xa5,0,0x18,0x65,0xba,0x85,0xba,0xa5,1,0x65,0xbb,
         0x85,0xbb,0x90,6,0xa9,0xff,0x85,0xba,0x85,0xbb,0xad,8,1,0x85,0,0xad,9,1,0x85,1,0x20,0xcb,
         199,0xf0,0xa5,0,0x18);
  return;
}

Assistant:

static void support_2_byte_xp_gold(dw_rom *rom)
{
    int ss_lvl = 1; /* level to not scale metal slime xp */

    if (SCALED_SLIMES(rom)) {
        printf("Reducing early metal rewards...\n");
        if (rom->enemies[METAL_SLIME].xp > 255)
            rom->enemies[METAL_SLIME].xp = 255; /* make sure xp <= 255 */
        ss_lvl = 8;
    }

    /* Note that this code won't work properly if scaled slimes is on and
     * metal slimes are set to give more than 255XP. If that is changed then
     * this code will need to be reworked.
     */
    vpatch(rom, 0x0ea0f,   77,
        0xad,  0x07,  0x01,  /*     lda $0107                                */
        0x85,  0x01,         /*     sta $01                                  */
        0xa5,  0xe0,         /*     lda $e0  ;                               */
        0xc9,  0x10,         /*     cmp #16  ;                               */
        0xd0,  0x0d,         /*     bne +                                    */
        0xa5,  0xc7,         /*     lda $c7                                  */
        0xc9,  ss_lvl,       /*     cmp ss_lvl                               */
        0xb0,  0x07,         /*     bcs +                                    */
        0x0a,                /*     asl                                      */
        0x0a,                /*     asl                                      */
        0x0a,                /*     asl                                      */
        0x0a,                /*     asl                                      */
        0x0a,                /*     asl                                      */
        0x85,  0x00,         /*     sta $00                                  */
        0x20,  0xcb,  0xc7,  /* +   jsr b3_c7cb                              */
        0xef,                /*     hex ef                                   */
        0xa5,  0x00,         /*     lda $00                                  */
        0x18,                /*     clc                                      */
        0x65,  0xba,         /*     adc $ba                                  */
        0x85,  0xba,         /*     sta $ba                                  */
        0xa5,  0x01,         /*     lda $01                                  */
        0x65,  0xbb,         /*     adc $bb                                  */
        0x85,  0xbb,         /*     sta $bb                                  */
        0x90,  0x06,         /*     bcc +                                    */
        0xa9,  0xff,         /*     lda #$ff                                 */
        0x85,  0xba,         /*     sta $ba                                  */
        0x85,  0xbb,         /*     sta $bb                                  */
        0xad,  0x08,  0x01,  /* +   lda $0108                                */
        0x85,  0x00,         /*     sta $00                                  */
        0xad,  0x09,  0x01,  /*     lda $0109                                */
        0x85,  0x01,         /*     sta $01                                  */
        0x20,  0xcb,  0xc7,  /*     jsr b3_c7cb                              */
        0xf0,                /*     hex f0                                   */
        0xa5,  0x00,         /*     lda $00                                  */
        0x18,                /*     clc                                      */
        0x65,  0xbc,         /*     adc $bc                                  */
        0x85,  0xbc,         /*     sta $bc                                  */
        0xa5,  0x01,         /*     lda $01                                  */
        0x65,  0xbd,         /*     adc $bd                                  */
        0x85,  0xbd,         /*     sta $bd                                  */
        0x90                 /*     bcc b3_ea63                              */
    );
}